

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O2

int __thiscall coda_url::assign_refers(coda_url *this,char *beg,uint32_t flags)

{
  char *__dest;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *s;
  uint uVar5;
  char *__src;
  
  __dest = coda_strnchr(this->val_str,'?',(ulong)this->val_len);
  pcVar1 = this->val_str + this->val_len;
  pcVar2 = beg;
  pcVar4 = beg;
  __src = __dest;
  if (__dest == (char *)0x0) {
    __dest = pcVar1;
    __src = pcVar1;
  }
LAB_00105c60:
  s = pcVar4;
  pcVar4 = pcVar2;
  if (pcVar4 < __dest) {
    if (*pcVar4 == '/') {
      if ((__dest + -4 < pcVar4) || (pcVar2 = coda_strnstr(pcVar4,"/../",4), pcVar2 == (char *)0x0))
      {
        pcVar2 = pcVar4;
        if ((__dest + -3 < pcVar4) || (pcVar3 = coda_strnstr(pcVar4,"/./",3), pcVar3 == (char *)0x0)
           ) {
          if ((__dest + -2 < pcVar4) ||
             (pcVar3 = coda_strnstr(pcVar4,"//",2), pcVar3 == (char *)0x0)) {
            pcVar2 = pcVar4 + 1;
          }
          else {
            memmove(pcVar4,pcVar4 + 1,(long)__dest - (long)(pcVar4 + 1));
            pcVar4 = s;
            __dest = __dest + -1;
          }
        }
        else {
          memmove(pcVar4,pcVar4 + 2,(long)__dest - (long)(pcVar4 + 2));
          pcVar4 = s;
          __dest = __dest + -2;
        }
      }
      else {
        pcVar4 = pcVar4 + 3;
        memmove(s,pcVar4,(long)__dest - (long)pcVar4);
        __dest = __dest + ((long)s - (long)pcVar4);
        pcVar3 = s;
        do {
          pcVar3 = pcVar3 + -1;
          pcVar2 = s;
          pcVar4 = s;
          if (pcVar3 < beg) break;
          pcVar4 = pcVar3;
        } while (*pcVar3 != '/');
      }
    }
    else {
      pcVar2 = pcVar4 + 1;
      pcVar4 = s;
    }
    goto LAB_00105c60;
  }
  if ((s == __dest + -3) && (pcVar2 = coda_strnstr(s,"/..",3), pcVar2 != (char *)0x0)) {
    pcVar2 = s;
    if (beg < s) {
      do {
        pcVar4 = pcVar2;
        pcVar2 = pcVar4 + -1;
        if (pcVar2 < beg) goto LAB_00105e51;
      } while (*pcVar2 != '/');
      if (pcVar2 <= beg) {
        pcVar2 = pcVar4;
      }
      if ((flags & 1) != 0) {
        pcVar2 = pcVar4;
      }
      __dest = __dest + (long)(pcVar2 + (-3 - (long)s));
    }
    else {
      __dest = __dest + -2;
    }
  }
  else {
    pcVar2 = __dest + -2;
    if ((s == pcVar2) && (pcVar4 = coda_strnstr(s,"/.",2), pcVar4 != (char *)0x0)) {
      __dest = __dest + -1;
      if (s <= beg) {
        pcVar2 = __dest;
      }
    }
    else {
      if (s != __dest + -1) goto LAB_00105e51;
      pcVar4 = coda_strnstr(s,"/",1);
      pcVar2 = __dest + -1;
      if (s <= beg) {
        pcVar2 = __dest;
      }
      if (pcVar4 == (char *)0x0) {
        pcVar2 = __dest;
      }
    }
    if ((flags & 1) == 0) {
      __dest = pcVar2;
    }
  }
LAB_00105e51:
  if (pcVar1 != __src) {
    memmove(__dest,__src,(long)pcVar1 - (long)__src);
    __dest = __dest + ((long)pcVar1 - (long)__src);
  }
  uVar5 = (int)__dest - (int)this->val_str;
  this->val_len = uVar5;
  memcpy(this->val_str + (ulong)uVar5 + 1,this->dom_str,(ulong)this->dom_len);
  this->dom_str = this->val_str + this->val_len + 1;
  this->val_str[this->val_len] = '\0';
  this->dom_str[this->dom_len] = '\0';
  return 0;
}

Assistant:

int coda_url::assign_refers(char *beg, uint32_t flags)
{
	char *eofp = coda_strnchr(val_str, '?', val_len);
	if (NULL == eofp) eofp = val_str + val_len;

	char *args = eofp;
	size_t args_len = val_str + val_len - args;

	char *p = beg;
	char *prev = p;

	while (p < eofp)
	{
		if (*p == '/')
		{
			if (p <= eofp - 4 && coda_strnstr(p, "/../", 4) != 0) // /foo/../bar -> /bar
			{
				memmove(prev, p + 3, eofp - (p + 3));
				eofp -= p + 3 - prev;

				p = prev;

				for (char *pp = p - 1; pp >= beg; --pp)
				{
					if (*pp == '/')
					{
						prev = pp;
						break;
					}
				}
			}
			else if (p <= eofp - 3 && coda_strnstr(p, "/./", 3) != 0) // /foo/./bar -> /foo/bar
			{
				memmove(p, p + 2, eofp - (p + 2));
				eofp -= 2;
			}
#if 1
			/*
			 * mozilla & opera thinks that // is directory with empty name
			 * but in unix-paths // == /./ let's think as mozilla, but just comment 
			 * this code for potential future usage.
			 */
			else if (p <= eofp - 2 && coda_strnstr(p, "//", 2) != 0) // /foo//bar -> /foo/bar
			{
				memmove(p, p + 1, eofp - (p + 1));
				eofp -= 1;
			}
#endif
			else
			{
				prev = p;
				++p;
			}
		}
		else
		{
			++p;
		}
	}